

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O2

string * __thiscall
antlr::MismatchedCharException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,MismatchedCharException *this)

{
  int in_EDX;
  int ch;
  int ch_00;
  int ch_01;
  int ch_02;
  int ch_03;
  int ch_04;
  char *__rhs;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  uint uVar2;
  string *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> elems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->mismatchType) {
  case 1:
    charName_abi_cxx11_(&local_b0,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    std::operator+(&local_f0,"expecting \'",&local_b0);
    std::operator+(&local_130,&local_f0,"\', found \'");
    charName_abi_cxx11_(&local_d0,(antlr *)(ulong)(uint)this->foundChar,ch_04);
    std::operator+(&local_110,&local_130,&local_d0);
    std::operator+(&local_150,&local_110,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    this_00 = &local_b0;
    break;
  case 2:
    charName_abi_cxx11_(&local_130,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    std::operator+(&local_110,"expecting anything but \'",&local_130);
    std::operator+(&local_150,&local_110,"\'; got it anyway");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    this_00 = &local_130;
    break;
  case 3:
    charName_abi_cxx11_(&local_50,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    std::operator+(&local_d0,"expecting token in range: \'",&local_50);
    std::operator+(&local_b0,&local_d0,"\'..\'");
    charName_abi_cxx11_(&local_70,(antlr *)(ulong)(uint)this->upper,ch_00);
    std::operator+(&local_f0,&local_b0,&local_70);
    std::operator+(&local_130,&local_f0,"\', found \'");
    charName_abi_cxx11_(&local_90,(antlr *)(ulong)(uint)this->foundChar,ch_01);
    std::operator+(&local_110,&local_130,&local_90);
    std::operator+(&local_150,&local_110,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_0015de34;
  case 4:
    charName_abi_cxx11_(&local_50,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    std::operator+(&local_d0,"expecting token NOT in range: ",&local_50);
    std::operator+(&local_b0,&local_d0,"\'..\'");
    charName_abi_cxx11_(&local_70,(antlr *)(ulong)(uint)this->upper,ch_02);
    std::operator+(&local_f0,&local_b0,&local_70);
    std::operator+(&local_130,&local_f0,"\', found \'");
    charName_abi_cxx11_(&local_90,(antlr *)(ulong)(uint)this->foundChar,ch_03);
    std::operator+(&local_110,&local_130,&local_90);
    std::operator+(&local_150,&local_110,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0015de34:
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = &local_50;
    break;
  case 5:
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"expecting ",(allocator<char> *)&local_f0);
    __rhs = "";
    if (this->mismatchType == 6) {
      __rhs = "NOT ";
    }
    std::operator+(&local_110,&local_130,__rhs);
    std::operator+(&local_150,&local_110,"one of (");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    BitSet::toArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,&this->set);
    uVar1 = extraout_RDX;
    for (uVar2 = 0;
        (ulong)uVar2 <
        (ulong)((long)(local_f0._M_string_length - (long)local_f0._M_dataplus._M_p) >> 2);
        uVar2 = uVar2 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      charName_abi_cxx11_(&local_150,
                          (antlr *)(ulong)*(uint *)(local_f0._M_dataplus._M_p + (ulong)uVar2 * 4),ch
                         );
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = extraout_RDX_00;
    }
    charName_abi_cxx11_(&local_130,(antlr *)(ulong)(uint)this->foundChar,(int)uVar1);
    std::operator+(&local_110,"), found \'",&local_130);
    std::operator+(&local_150,&local_110,"\'");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
    return __return_storage_ptr__;
  default:
    std::__cxx11::string::string
              ((string *)&local_150,
               (string *)&(this->super_RecognitionException).super_ANTLRException.text);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_00 = &local_150;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string MismatchedCharException::getMessage() const
{
	ANTLR_USE_NAMESPACE(std)string s;

	switch (mismatchType) {
	case CHAR :
		s += "expecting '" + charName(expecting) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_CHAR :
		s += "expecting anything but '" + charName(expecting) + "'; got it anyway";
		break;
	case RANGE :
		s += "expecting token in range: '" + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_RANGE :
		s += "expecting token NOT in range: " + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case SET :
	case NOT_SET :
		{
			s += ANTLR_USE_NAMESPACE(std)string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems = set.toArray();
			for ( unsigned int i = 0; i < elems.size(); i++ )
			{
				s += " '";
				s += charName(elems[i]);
				s += "'";
			}
			s += "), found '" + charName(foundChar) + "'";
		}
		break;
	default :
		s += RecognitionException::getMessage();
		break;
	}

	return s;
}